

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_mesh_vbuf.cxx
# Opt level: O3

void __thiscall
xray_re::xr_mesh_vbuf::transform_points
          (xr_mesh_vbuf *this,fvector3 *source,fvector3 *target,size_t size,fmatrix *xform)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  long lVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dStack_88;
  dmatrix m;
  
  lVar3 = 0xe;
  do {
    uVar1 = *(undefined8 *)((long)&xform->field_0 + lVar3 * 4);
    dVar4 = (double)(float)((ulong)uVar1 >> 0x20);
    auVar2._8_4_ = SUB84(dVar4,0);
    auVar2._0_8_ = (double)(float)uVar1;
    auVar2._12_4_ = (int)((ulong)dVar4 >> 0x20);
    *(undefined1 (*) [16])(&dStack_88 + lVar3) = auVar2;
    lVar3 = lVar3 + -2;
  } while (lVar3 != -2);
  if (size != 0) {
    lVar3 = 0;
    do {
      dVar4 = (double)*(float *)((long)&source->field_0 + lVar3);
      dVar5 = (double)*(float *)((long)&source->field_0 + lVar3 + 4);
      dVar6 = (double)*(float *)((long)&source->field_0 + lVar3 + 8);
      *(ulong *)((long)&target->field_0 + lVar3) =
           CONCAT44((float)(dVar6 * m.field_0.field_0._31 +
                           dVar5 * m.field_0.field_0._21 +
                           dVar4 * m.field_0.field_0._11 + m.field_0.field_0._41),
                    (float)(dVar6 * m.field_0.field_0._24 +
                           dVar5 * m.field_0.field_0._14 + dVar4 * dStack_88 + m.field_0.field_0._34
                           ));
      *(float *)((long)&target->field_0 + lVar3 + 8) =
           (float)(m.field_0.field_0._32 * dVar6 +
                  m.field_0.field_0._22 * dVar5 +
                  m.field_0.field_0._12 * dVar4 + m.field_0.field_0._42);
      lVar3 = lVar3 + 0xc;
      size = size - 1;
    } while (size != 0);
  }
  return;
}

Assistant:

void xr_mesh_vbuf::transform_points(const fvector3* source, fvector3* target, size_t size,
		const fmatrix& xform) const
{
	dmatrix m;
	m.set(xform);
	for (; size != 0; --size, ++target)
		target->set(dvector3().set(*source++).transform(m));
}